

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O0

matrix<trng::GF2,_521UL> *
trng::power<trng::GF2,521ul>(matrix<trng::GF2,_521UL> *a,unsigned_long_long m)

{
  ulong in_RDX;
  matrix<trng::GF2,_521UL> *in_RDI;
  matrix_type powers;
  matrix<trng::GF2,_521UL> *in_stack_00000068;
  anon_class_1_0_00000001 unit;
  matrix_type *res;
  matrix<trng::GF2,_521UL> *this;
  ulong local_18;
  
  this = in_RDI;
  matrix<trng::GF2,521ul>::
  matrix<trng::power<trng::GF2,521ul>(trng::matrix<trng::GF2,521ul>const&,unsigned_long_long)::_lambda(unsigned_long,unsigned_long)_1_>
            ();
  matrix<trng::GF2,_521UL>::matrix(this,in_RDI);
  local_18 = in_RDX;
  while (local_18 != 0) {
    if ((local_18 & 1) == 1) {
      operator*(in_stack_00000068,
                (matrix<trng::GF2,_521UL> *)
                powers.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
      matrix<trng::GF2,_521UL>::operator=(this,in_RDI);
      matrix<trng::GF2,_521UL>::~matrix((matrix<trng::GF2,_521UL> *)0x2ce78a);
    }
    local_18 = local_18 >> 1;
    if (local_18 == 0) break;
    operator*(in_stack_00000068,
              (matrix<trng::GF2,_521UL> *)
              powers.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
    matrix<trng::GF2,_521UL>::operator=(this,in_RDI);
    matrix<trng::GF2,_521UL>::~matrix((matrix<trng::GF2,_521UL> *)0x2ce7fd);
  }
  matrix<trng::GF2,_521UL>::~matrix((matrix<trng::GF2,_521UL> *)0x2ce811);
  return this;
}

Assistant:

matrix<T, n> power(const matrix<T, n> &a, unsigned long long m) {
    using matrix_type = matrix<T, n>;
    using size_type = typename matrix_type::size_type;

    auto unit = [&](size_type i, size_type j) -> T { return i == j ? T{1} : T{0}; };
    matrix_type res(unit);
    matrix_type powers(a);
    while (m > 0) {
      if ((m & 1ull) == 1ull)
        res = res * powers;
      m >>= 1u;
      if (m == 0)
        break;
      powers = powers * powers;
    }
    return res;
  }